

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O0

wchar_t blow_index(char *name)

{
  wchar_t wVar1;
  blow_effect *effect;
  wchar_t i;
  char *name_local;
  
  effect._4_4_ = L'\x01';
  while( true ) {
    if ((int)(uint)z_info->blow_effects_max <= effect._4_4_) {
      return L'\0';
    }
    wVar1 = my_stricmp(name,blow_effects[effect._4_4_].name);
    if (wVar1 == L'\0') break;
    effect._4_4_ = effect._4_4_ + L'\x01';
  }
  return effect._4_4_;
}

Assistant:

int blow_index(const char *name)
{
	int i;

	for (i = 1; i < z_info->blow_effects_max; i++) {
		struct blow_effect *effect = &blow_effects[i];
		if (my_stricmp(name, effect->name) == 0)
			return i;
	}
	return 0;
}